

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall Assimp::ColladaExporter::WriteAnimationsLibrary(ColladaExporter *this)

{
  ostream *poVar1;
  size_t a;
  ulong pIndex;
  string scene_name_escaped;
  allocator local_69;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_68,(this->mScene->mRootNode->mName).data,&local_69);
  XMLEscape(&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (this->mScene->mNumAnimations != 0) {
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"<library_animations>");
    std::operator<<(poVar1,(string *)&this->endstr);
    PushTag(this);
    for (pIndex = 0; pIndex < this->mScene->mNumAnimations; pIndex = pIndex + 1) {
      WriteAnimationLibrary(this,pIndex);
    }
    PopTag(this);
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"</library_animations>");
    std::operator<<(poVar1,(string *)&this->endstr);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void ColladaExporter::WriteAnimationsLibrary()
{
	const std::string scene_name_escaped = XMLEscape(mScene->mRootNode->mName.C_Str());
	
	if ( mScene->mNumAnimations > 0 ) {
		mOutput << startstr << "<library_animations>" << endstr;
		PushTag();
		
		// start recursive write at the root node
		for( size_t a = 0; a < mScene->mNumAnimations; ++a)
			WriteAnimationLibrary( a );

		PopTag();
		mOutput << startstr << "</library_animations>" << endstr;
	}
}